

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  Ast pre_eval;
  Ast post_eval;
  Parse_ast parse;
  char local_69;
  Ast local_68;
  Ast local_58;
  istream *local_48;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_40;
  
  get_program((int)&local_48,(char **)(ulong)(uint)argc);
  lambda::parse_from((Parse_ast *)&local_40,local_48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"parse: ",7);
  poVar1 = lambda::operator<<((ostream *)&std::cout,(Parse_ast *)&local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n",2);
  lambda::reduce((lambda *)&local_68,(Parse_ast *)&local_40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"typed: ",7);
  poVar1 = lambda::operator<<((ostream *)&std::cout,&local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n",2);
  lambda::eval((lambda *)&local_58,&local_68);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"eval\'d: ",8);
  poVar1 = lambda::operator<<((ostream *)&std::cout,&local_58);
  local_69 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_69,1);
  if (local_58.underlying_.
      super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.underlying_.
               super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_68.underlying_.
      super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.underlying_.
               super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::~_Variant_storage(&local_40);
  (**(code **)(*(long *)local_48 + 8))(local_48);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  auto file = get_program(argc, argv);

  auto parse = [&] {
    try {
      return lambda::parse_from(*file);
    } catch (lambda::Parse_error const& e) {
      ublib::failwith(e);
    }
  }();

  std::cout << "parse: " << parse << "\n\n";

  auto const pre_eval = lambda::reduce(parse);
  std::cout << "typed: " << pre_eval << "\n\n";   

  auto const post_eval = eval(pre_eval);
  std::cout << "eval'd: " << post_eval << '\n';
}